

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O0

u32 irr::core::strtoul10(char *in,char **out)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  u32 tmp;
  u32 unsignedValue;
  bool overflow;
  char **out_local;
  char *in_local;
  u32 local_4;
  
  if (in == (char *)0x0) {
    if (out != (char **)0x0) {
      *out = (char *)0x0;
    }
    local_4 = 0;
  }
  else {
    bVar2 = false;
    unsignedValue = 0;
    in_local = in;
    while( true ) {
      bVar1 = false;
      if ('/' < *in_local) {
        bVar1 = *in_local < ':';
      }
      if (!bVar1) break;
      uVar3 = unsignedValue * 10 + *in_local + -0x30;
      if (uVar3 < unsignedValue) {
        unsignedValue = 0xffffffff;
        bVar2 = true;
      }
      if (!bVar2) {
        unsignedValue = uVar3;
      }
      in_local = in_local + 1;
    }
    if (out != (char **)0x0) {
      *out = in_local;
    }
    local_4 = unsignedValue;
  }
  return local_4;
}

Assistant:

inline u32 strtoul10(const char *in, const char **out = 0)
{
	if (!in) {
		if (out)
			*out = in;
		return 0;
	}

	bool overflow = false;
	u32 unsignedValue = 0;
	while ((*in >= '0') && (*in <= '9')) {
		const u32 tmp = (unsignedValue * 10) + (*in - '0');
		if (tmp < unsignedValue) {
			unsignedValue = (u32)0xffffffff;
			overflow = true;
		}
		if (!overflow)
			unsignedValue = tmp;
		++in;
	}

	if (out)
		*out = in;

	return unsignedValue;
}